

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  value_type local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  getStrictSubTypes(__return_storage_ptr__,this,type);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            (__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getSubTypes(HeapType type) {
    auto ret = getStrictSubTypes(type);
    ret.push_back(type);
    return ret;
  }